

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O2

ON_PointGrid * __thiscall ON_PointGrid::operator=(ON_PointGrid *this,ON_PointGrid *src)

{
  double *pdVar1;
  ON_3dPoint *pOVar2;
  double dVar3;
  int iVar4;
  ON_3dPoint *pOVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int i;
  int i_00;
  
  if (this != src) {
    ON_Object::operator=((ON_Object *)this,(ON_Object *)src);
    iVar6 = src->m_point_count[0];
    this->m_point_count[0] = iVar6;
    iVar4 = src->m_point_count[1];
    this->m_point_count[1] = iVar4;
    this->m_point_stride0 = iVar4;
    ON_SimpleArray<ON_3dPoint>::Reserve
              (&(this->m_point).super_ON_SimpleArray<ON_3dPoint>,(long)(iVar4 * iVar6));
    iVar6 = this->m_point_count[0];
    iVar4 = this->m_point_count[1];
    uVar8 = iVar4 * iVar6;
    if ((-1 < (int)uVar8) &&
       ((int)uVar8 <= (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_capacity)) {
      (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_count = uVar8;
    }
    if (0 < (int)uVar8) {
      if (this->m_point_stride0 == src->m_point_stride0) {
        memcpy((this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a,
               (src->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a,(ulong)uVar8 * 0x18);
      }
      else {
        for (i_00 = 0; i_00 < iVar6; i_00 = i_00 + 1) {
          lVar10 = 0;
          for (lVar9 = 0; lVar9 < iVar4; lVar9 = lVar9 + 1) {
            pOVar5 = operator[](src,i_00);
            pOVar2 = (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a;
            lVar7 = (long)this->m_point_stride0 * (long)i_00 + lVar9;
            pOVar2[lVar7].z = *(double *)((long)&pOVar5->z + lVar10);
            pdVar1 = (double *)((long)&pOVar5->x + lVar10);
            dVar3 = pdVar1[1];
            pOVar2 = pOVar2 + lVar7;
            pOVar2->x = *pdVar1;
            pOVar2->y = dVar3;
            iVar4 = this->m_point_count[1];
            lVar10 = lVar10 + 0x18;
          }
          iVar6 = this->m_point_count[0];
        }
      }
    }
  }
  return this;
}

Assistant:

ON_PointGrid& ON_PointGrid::operator=( const ON_PointGrid& src )
{
  if ( this != &src ) {
    ON_Geometry::operator=(src);
    m_point_count[0] = src.m_point_count[0];
    m_point_count[1] = src.m_point_count[1];
    m_point_stride0 = m_point_count[1];
    m_point.Reserve(PointCount());
    m_point.SetCount(PointCount());
    if ( PointCount() > 0 ) {
      // copy cv array
      if ( m_point_stride0 == src.m_point_stride0 ) {
        memcpy( m_point.Array(), src.m_point.Array(), PointCount()*sizeof(ON_3dPoint) );
      }
      else {
        int i, j;
        for ( i = 0; i < m_point_count[0]; i++ ) for ( j = 0; j < m_point_count[1]; j++ ) {
          m_point[i*m_point_stride0+j] = src[i][j];
        }
      }
    }
  }
  return *this;
}